

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::DoMarkArgsAsVars<mp::NLBaseReif<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,NLBaseReif<1> *con,int param_2)

{
  VarArray1 VVar1;
  _Type local_4c;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  _Any_data local_28;
  _Manager_type local_18;
  
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_28,(function<void_(int)> *)this);
  VVar1 = NLBaseReif<1>::GetArguments(con);
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_48,(function<void_(int)> *)&local_28);
  local_4c[0] = VVar1._M_elems[0];
  if (local_38 != (code *)0x0) {
    (*local_30)(&local_48,local_4c);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }